

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm.cpp
# Opt level: O3

int __thiscall ncnn::LayerNorm::forward_inplace(LayerNorm *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  void *pvVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  float fVar15;
  
  if (bottom_top_blob->dims == 3) {
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar7 = bottom_top_blob->h * bottom_top_blob->w;
      uVar8 = (ulong)uVar7;
      pvVar11 = bottom_top_blob->data;
      sVar5 = bottom_top_blob->cstep;
      iVar2 = this->affine;
      pvVar3 = (this->gamma_data).data;
      pvVar4 = (this->beta_data).data;
      sVar6 = bottom_top_blob->elemsize;
      lVar10 = 0;
      do {
        fVar12 = 0.0;
        if ((int)uVar7 < 1) {
LAB_00300181:
          fVar15 = 0.0;
        }
        else {
          uVar9 = 0;
          do {
            fVar12 = fVar12 + *(float *)((long)pvVar11 + uVar9 * 4);
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
          fVar12 = fVar12 * (1.0 / (float)(int)uVar7);
          if ((int)uVar7 < 1) goto LAB_00300181;
          fVar15 = 0.0;
          uVar9 = 0;
          do {
            fVar13 = *(float *)((long)pvVar11 + uVar9 * 4) - fVar12;
            fVar15 = fVar15 + fVar13 * fVar13;
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
        }
        fVar13 = fVar15 * (1.0 / (float)(int)uVar7) + this->eps;
        auVar14 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar13));
        fVar15 = auVar14._0_4_;
        fVar15 = fVar15 * -0.5 * (fVar13 * fVar15 * fVar15 + -3.0);
        if (iVar2 == 0) {
          if (0 < (int)uVar7) {
            uVar9 = 0;
            do {
              *(float *)((long)pvVar11 + uVar9 * 4) =
                   *(float *)((long)pvVar11 + uVar9 * 4) * fVar15 + -fVar12 * fVar15;
              uVar9 = uVar9 + 1;
            } while (uVar8 != uVar9);
          }
        }
        else if (0 < (int)uVar7) {
          uVar9 = 0;
          do {
            *(float *)((long)pvVar11 + uVar9 * 4) =
                 (*(float *)((long)pvVar11 + uVar9 * 4) * fVar15 + -fVar12 * fVar15) *
                 *(float *)((long)pvVar3 + uVar9 * 4) + *(float *)((long)pvVar4 + uVar9 * 4);
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
        }
        lVar10 = lVar10 + 1;
        pvVar11 = (void *)((long)pvVar11 + sVar5 * sVar6);
      } while (lVar10 != iVar1);
    }
  }
  else if ((bottom_top_blob->dims == 2) && (iVar1 = bottom_top_blob->h, 0 < (long)iVar1)) {
    uVar7 = bottom_top_blob->w;
    uVar8 = (ulong)uVar7;
    pvVar11 = bottom_top_blob->data;
    iVar2 = this->affine;
    pvVar3 = (this->gamma_data).data;
    pvVar4 = (this->beta_data).data;
    sVar5 = bottom_top_blob->elemsize;
    lVar10 = 0;
    do {
      fVar12 = 0.0;
      if ((int)uVar7 < 1) {
LAB_00300049:
        fVar15 = 0.0;
      }
      else {
        uVar9 = 0;
        do {
          fVar12 = fVar12 + *(float *)((long)pvVar11 + uVar9 * 4);
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
        fVar12 = fVar12 * (1.0 / (float)(int)uVar7);
        if ((int)uVar7 < 1) goto LAB_00300049;
        fVar15 = 0.0;
        uVar9 = 0;
        do {
          fVar13 = *(float *)((long)pvVar11 + uVar9 * 4) - fVar12;
          fVar15 = fVar15 + fVar13 * fVar13;
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      fVar13 = fVar15 * (1.0 / (float)(int)uVar7) + this->eps;
      auVar14 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar13));
      fVar15 = auVar14._0_4_;
      fVar15 = fVar15 * -0.5 * (fVar13 * fVar15 * fVar15 + -3.0);
      if (iVar2 == 0) {
        if (0 < (int)uVar7) {
          uVar9 = 0;
          do {
            *(float *)((long)pvVar11 + uVar9 * 4) =
                 *(float *)((long)pvVar11 + uVar9 * 4) * fVar15 + -fVar12 * fVar15;
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
        }
      }
      else if (0 < (int)uVar7) {
        uVar9 = 0;
        do {
          *(float *)((long)pvVar11 + uVar9 * 4) =
               (*(float *)((long)pvVar11 + uVar9 * 4) * fVar15 + -fVar12 * fVar15) *
               *(float *)((long)pvVar3 + uVar9 * 4) + *(float *)((long)pvVar4 + uVar9 * 4);
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      lVar10 = lVar10 + 1;
      pvVar11 = (void *)((long)pvVar11 + (long)(int)uVar7 * sVar5);
    } while (lVar10 != iVar1);
  }
  return 0;
}

Assistant:

int LayerNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / sqrt(var + eps) * gamma + beta

    int dims = bottom_top_blob.dims;

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        // assert affine_size == w

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            // mean and var
            float sum = 0.f;
            float sqsum = 0.f;
            for (int j = 0; j < w; j++)
            {
                sum += ptr[j];
                //sqsum += ptr[j] * ptr[j];
            }
            float mean = sum / w;
            float tmp = 0.f;
            for (int j = 0; j < w; j++)
            {
                tmp = ptr[j] - mean;
                sqsum += tmp * tmp;
            }
            float var = sqsum / w;
            // the var maybe minus due to accuracy
            //float var = sqsum / w - mean * mean;

            float a = static_cast<float>(1.f / (sqrt(var + eps)));
            float b = -mean * a;

            if (affine)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = (ptr[j] * a + b) * gamma_data[j] + beta_data[j];
                }
            }
            else
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = ptr[j] * a + b;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;
        // assert affine_size == size

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            // mean and var
            float sum = 0.f;
            float sqsum = 0.f;
            for (int i = 0; i < size; i++)
            {
                sum += ptr[i];
                //sqsum += ptr[i] * ptr[i];
            }
            float mean = sum / size;
            float tmp = 0.f;
            for (int i = 0; i < size; i++)
            {
                tmp = ptr[i] - mean;
                sqsum += tmp * tmp;
            }
            float var = sqsum / size;
            // the var maybe minus due to accuracy
            //float var = sqsum / size - mean * mean;

            float a = static_cast<float>(1.f / (sqrt(var + eps)));
            float b = -mean * a;

            if (affine)
            {
                for (int i = 0; i < size; i++)
                {
                    ptr[i] = (ptr[i] * a + b) * gamma_data[i] + beta_data[i];
                }
            }
            else
            {
                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * a + b;
                }
            }
        }
    }

    return 0;
}